

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StringReplace(string *s,string *oldsub,string *newsub,bool replace_all)

{
  string *in_RCX;
  undefined8 in_RDX;
  undefined1 replace_all_00;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  string *ret;
  string *oldsub_00;
  
  replace_all_00 = (undefined1)((ulong)in_RDX >> 0x38);
  oldsub_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringReplace(unaff_retaddr,oldsub_00,in_RSI,(bool)replace_all_00,in_RCX);
  return in_RDI;
}

Assistant:

std::string StringReplace(const std::string &s, const std::string &oldsub,
                          const std::string &newsub, bool replace_all) {
  std::string ret;
  StringReplace(s, oldsub, newsub, replace_all, &ret);
  return ret;
}